

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
(anonymous_namespace)::GetOSReleaseVariables_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  string *psVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX;
  istream *piVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  cmValue value;
  ulong uVar13;
  string *psVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  pointer pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long lVar17;
  long lVar18;
  pointer name;
  iterator __first;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string result_variable;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scripts;
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  kv;
  string findExpr;
  string value_1;
  cmList variables;
  Glob gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [32];
  cmMakefile *local_348;
  undefined1 local_340 [24];
  char local_328 [8];
  char *local_320;
  undefined8 local_318;
  undefined1 auStack_310 [16];
  bool local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [32];
  pointer local_2b8;
  undefined1 local_2b0 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  cmList local_250;
  undefined1 local_238 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [30];
  
  local_238._0_8_ = local_238 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"CMAKE_SYSROOT","");
  psVar10 = cmMakefile::GetSafeDefinition((cmMakefile *)__return_storage_ptr__,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
  s_os_release_abi_cxx11_._8_4_ = 0;
  GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
  s_os_release_abi_cxx11_._16_8_ = 0;
  GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
  s_os_release_abi_cxx11_._24_8_ = 0xb4be10;
  GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
  s_os_release_abi_cxx11_._32_8_ = 0xb4be10;
  GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
  s_os_release_abi_cxx11_._40_8_ = 0;
  local_2b0._0_8_ = (pointer)0xf;
  local_218[0]._0_8_ = "/etc/os-release";
  local_2b0._8_8_ = "/etc/os-release";
  local_2b0._16_8_ = 0x13;
  local_2b0._24_8_ = "/usr/lib/os-release";
  local_238._24_8_ = 0xf;
  lVar17 = 0x10;
  local_348 = (cmMakefile *)__return_storage_ptr__;
  while( true ) {
    local_238._8_8_ = (psVar10->_M_dataplus)._M_p;
    local_238._0_8_ = psVar10->_M_string_length;
    local_238._16_8_ = 0;
    local_218[0]._8_8_ = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_238;
    cmCatViews((string *)local_2d8,views);
    bVar7 = cmsys::SystemTools::FileExists((string *)local_2d8);
    if (bVar7) break;
    pmVar12 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2d8 + 0x10);
    if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2d8._0_8_ != pmVar12) {
      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
      pmVar12 = extraout_RAX;
    }
    if (lVar17 == 0x20) goto LAB_003a021b;
    local_238._24_8_ = *(undefined8 *)(local_2b0 + lVar17);
    local_218[0]._0_8_ = *(undefined8 *)(local_2b0 + lVar17 + 8);
    lVar17 = lVar17 + 0x10;
  }
  std::ifstream::ifstream(local_238,(char *)local_2d8._0_8_,_S_in);
  local_368._0_8_ = local_368 + 0x10;
  local_368._8_8_ = (pointer)0x0;
  local_368._16_8_ = local_368._16_8_ & 0xffffffffffffff00;
  while( true ) {
    cVar8 = std::ios::widen((char)*(undefined8 *)(local_238._0_8_ + -0x18) +
                            (char)(istream *)local_238);
    piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_238,(string *)local_368,cVar8);
    uVar5 = local_368._8_8_;
    if (((&piVar11->field_0x20)[(long)piVar11->_vptr_basic_istream[-3]] & 5) != 0) break;
    local_2b8 = (pointer)local_368._0_8_;
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_local_buf[0] = '\0';
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    local_388._M_string_length = 0;
    local_388.field_2._M_local_buf[0] = '\0';
    if ((pointer)local_368._8_8_ == (pointer)0x0) {
LAB_003a00d8:
      local_300 = false;
    }
    else {
      pbVar15 = (pointer)0x0;
      do {
        bVar2 = *(byte *)((long)&(pbVar15->_M_dataplus)._M_p + (long)&local_2b8->_M_dataplus);
        iVar9 = isalpha((int)(char)bVar2);
        if (bVar2 == 0x5f || iVar9 != 0) {
          std::__cxx11::string::push_back((char)&local_2f8);
        }
        else {
          iVar9 = isspace((uint)bVar2);
          if (iVar9 == 0) break;
        }
        pbVar15 = (pointer)((long)&(pbVar15->_M_dataplus)._M_p + 1);
      } while ((pointer)uVar5 != pbVar15);
      __return_storage_ptr__ =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_348;
      if ((local_2f8._M_string_length == 0) ||
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) goto LAB_003a00d8;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_290,&local_2f8,&local_388);
      local_340._0_8_ = local_340 + 0x10;
      paVar1 = &local_290.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290.first._M_dataplus._M_p == paVar1) {
        local_328[0] = local_290.first.field_2._M_local_buf[8];
        local_328[1] = local_290.first.field_2._M_local_buf[9];
        local_328[2] = local_290.first.field_2._M_local_buf[10];
        local_328[3] = local_290.first.field_2._M_local_buf[0xb];
        local_328[4] = local_290.first.field_2._M_local_buf[0xc];
        local_328[5] = local_290.first.field_2._M_local_buf[0xd];
        local_328[6] = local_290.first.field_2._M_local_buf[0xe];
        local_328[7] = local_290.first.field_2._M_local_buf[0xf];
      }
      else {
        local_340._0_8_ = local_290.first._M_dataplus._M_p;
      }
      local_340._16_8_ = local_290.first.field_2._M_allocated_capacity;
      local_340._8_8_ = local_290.first._M_string_length;
      local_290.first._M_string_length = 0;
      local_290.first.field_2._M_allocated_capacity =
           local_290.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290.second._M_dataplus._M_p == &local_290.second.field_2) {
        auStack_310._8_8_ = local_290.second.field_2._8_8_;
        local_320 = auStack_310;
      }
      else {
        local_320 = local_290.second._M_dataplus._M_p;
      }
      local_318 = local_290.second._M_string_length;
      local_300 = true;
      local_290.first._M_dataplus._M_p = (pointer)paVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,
                      CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                               local_388.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                               local_2f8.field_2._M_local_buf[0]) + 1);
    }
    if (local_300 == true) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                    ::s_os_release_abi_cxx11_,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_340);
    }
    if ((local_300 & 1U) != 0) {
      std::
      _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_destroy((_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_340);
    }
  }
  if ((pointer)local_368._0_8_ != (pointer)(local_368 + 0x10)) {
    operator_delete((void *)local_368._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_368._16_8_)->_M_p + 1));
  }
  std::ifstream::~ifstream(local_238);
  pmVar12 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_2d8 + 0x10);
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_2d8._0_8_ != pmVar12) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
    pmVar12 = extraout_RAX_00;
  }
LAB_003a021b:
  if (GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)::
      s_os_release_abi_cxx11_._40_8_ != 0) {
    return pmVar12;
  }
  cmsys::Glob::Glob((Glob *)local_238);
  local_368._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_368._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_368._16_8_ = (pointer)0x0;
  psVar10 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_340._8_8_ = (psVar10->_M_dataplus)._M_p;
  local_340._0_8_ = psVar10->_M_string_length;
  local_340._16_8_ = (char *)0x0;
  local_328[0] = '#';
  local_328[1] = '\0';
  local_328[2] = '\0';
  local_328[3] = '\0';
  local_328[4] = '\0';
  local_328[5] = '\0';
  local_328[6] = '\0';
  local_328[7] = '\0';
  local_320 = "/Modules/Internal/OSRelease/*.cmake";
  local_318 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_340;
  cmCatViews(&local_2f8,views_00);
  bVar7 = cmsys::Glob::FindFiles((Glob *)local_238,&local_2f8,(GlobMessages *)0x0);
  if (bVar7) {
    __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_368,__x);
  }
  local_340._0_8_ = local_340 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,"CMAKE_GET_OS_RELEASE_FALLBACK_SCRIPTS","");
  __it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
  value = cmMakefile::GetDefinition((cmMakefile *)__return_storage_ptr__,__it._M_current);
  if (value.Value != (string *)0x0) {
    __it._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368._8_8_;
    cmList::Insert((container_type *)local_368,(const_iterator)local_368._8_8_,value.Value,Yes,No);
  }
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    __it._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_340._16_8_ + 1)
    ;
    operator_delete((void *)local_340._0_8_,(ulong)__it._M_current);
  }
  uVar5 = local_368._8_8_;
  lVar17 = local_368._8_8_ - local_368._0_8_;
  pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368._0_8_;
  if (0 < lVar17 >> 7) {
    lVar18 = (lVar17 >> 7) + 1;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                            *)pbVar16,__it);
      __first._M_current = pbVar16;
      if (bVar7) goto LAB_003a03ee;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                            *)(pbVar16 + 1),__it);
      __first._M_current = pbVar16 + 1;
      if (bVar7) goto LAB_003a03ee;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                            *)(pbVar16 + 2),__it);
      __first._M_current = pbVar16 + 2;
      if (bVar7) goto LAB_003a03ee;
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                            *)(pbVar16 + 3),__it);
      __first._M_current = pbVar16 + 3;
      if (bVar7) goto LAB_003a03ee;
      pbVar16 = pbVar16 + 4;
      lVar18 = lVar18 + -1;
      lVar17 = lVar17 + -0x80;
    } while (1 < lVar18);
  }
  lVar17 = lVar17 >> 5;
  if (lVar17 == 1) {
LAB_003a03d5:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                          *)pbVar16,__it);
    __first._M_current = pbVar16;
    if (!bVar7) {
      __first._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5;
    }
  }
  else if (lVar17 == 2) {
LAB_003a03c5:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                          *)pbVar16,__it);
    __first._M_current = pbVar16;
    if (!bVar7) {
      pbVar16 = pbVar16 + 1;
      goto LAB_003a03d5;
    }
  }
  else {
    __first._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5;
    if (lVar17 != 3) goto LAB_003a042b;
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                          *)pbVar16,__it);
    __first._M_current = pbVar16;
    if (!bVar7) {
      pbVar16 = pbVar16 + 1;
      goto LAB_003a03c5;
    }
  }
LAB_003a03ee:
  pbVar16 = __first._M_current + 1;
  if (pbVar16 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5 &&
      __first._M_current !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5) {
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                            *)pbVar16,__it);
      if (!bVar7) {
        __it._M_current = pbVar16;
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)pbVar16);
        __first._M_current = __first._M_current + 1;
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5);
  }
LAB_003a042b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_368,__first,(iterator)local_368._8_8_);
  uVar6 = local_368._8_8_;
  uVar5 = local_368._0_8_;
  if (local_368._0_8_ != local_368._8_8_) {
    lVar18 = local_368._8_8_ - local_368._0_8_;
    uVar13 = lVar18 >> 5;
    lVar17 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
              (local_368._0_8_,local_368._8_8_,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar18 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                (uVar5,uVar6);
    }
    else {
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 + 0x200)
      ;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                (uVar5,pbVar16);
      for (; pbVar16 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar6;
          pbVar16 = pbVar16 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                  (pbVar16);
      }
    }
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"CMAKE_GET_OS_RELEASE_FALLBACK_RESULT","");
  local_2b8 = (pointer)local_368._8_8_;
  if (local_368._0_8_ != local_368._8_8_) {
    psVar10 = (string *)local_368._0_8_;
    do {
      cmMakefile::RemoveDefinition((cmMakefile *)__return_storage_ptr__,&local_388);
      bVar7 = cmMakefile::ReadListFile((cmMakefile *)__return_storage_ptr__,psVar10);
      if ((((bVar7) && (cmSystemTools::s_ErrorOccurred == false)) &&
          (cmSystemTools::s_FatalErrorOccurred == false)) &&
         (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
        psVar14 = (string *)
                  cmMakefile::GetDefinition((cmMakefile *)__return_storage_ptr__,&local_388);
        if (psVar14 == (string *)0x0) {
          psVar14 = &cmValue::Empty_abi_cxx11_;
        }
        pcVar3 = (psVar14->_M_dataplus)._M_p;
        local_340._0_8_ = local_340 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_340,pcVar3,pcVar3 + psVar14->_M_string_length);
        init._M_len = 1;
        init._M_array = (iterator)local_340;
        cmList::cmList(&local_250,init);
        if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
          operator_delete((void *)local_340._0_8_,(ulong)(local_340._16_8_ + 1));
        }
        pbVar15 = local_250.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        name = local_250.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        if (local_250.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_250.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            psVar14 = cmMakefile::GetSafeDefinition(local_348,name);
            pcVar3 = (psVar14->_M_dataplus)._M_p;
            local_2b0._0_8_ = local_2b0 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2b0,pcVar3,pcVar3 + psVar14->_M_string_length);
            cmMakefile::RemoveDefinition(local_348,name);
            pcVar3 = (name->_M_dataplus)._M_p;
            _Var4._M_p = (pointer)name->_M_string_length;
            local_290.first._M_dataplus._M_p = (pointer)local_388._M_string_length;
            local_290.first._M_string_length = (size_type)local_388._M_dataplus._M_p;
            local_290.first.field_2._M_allocated_capacity = 0;
            local_340._0_8_ = (pointer)0x0;
            local_340._8_8_ = 1;
            local_340._16_8_ = local_328;
            local_328[0] = 0x5f;
            local_290.first.field_2._8_8_ = 1;
            local_290.second._M_string_length = 0;
            views_01._M_len = 2;
            views_01._M_array = (iterator)&local_290;
            local_290.second._M_dataplus._M_p = (pointer)local_340._16_8_;
            cmCatViews((string *)local_2d8,views_01);
            __str._M_str = (char *)local_2d8._0_8_;
            __str._M_len = local_2d8._8_8_;
            local_340._0_8_ = _Var4._M_p;
            local_340._8_8_ = pcVar3;
            iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_340,0,
                               local_2d8._8_8_,__str);
            if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2d8._0_8_ !=
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_2d8 + 0x10)) {
              operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
            }
            if (iVar9 == 0) {
              std::__cxx11::string::substr((ulong)local_340,(ulong)name);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                            ::s_os_release_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0);
              if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
                operator_delete((void *)local_340._0_8_,(ulong)(local_340._16_8_ + 1));
              }
            }
            if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            name = name + 1;
          } while (name != pbVar15);
          if (GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
              ::s_os_release_abi_cxx11_._40_8_ != 0) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<char_const(&)[21],std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                          ::s_os_release_abi_cxx11_,(char (*) [21])"USED_FALLBACK_SCRIPT",psVar10);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_250.Values);
            __return_storage_ptr__ =
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_348;
            break;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_250.Values);
        __return_storage_ptr__ =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_348;
      }
      psVar10 = psVar10 + 1;
    } while (psVar10 != local_2b8);
  }
  cmMakefile::RemoveDefinition((cmMakefile *)__return_storage_ptr__,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,
                    CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                             local_2f8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_368);
  cmsys::Glob::~Glob((Glob *)local_238);
  return extraout_RAX_01;
}

Assistant:

std::map<std::string, std::string> GetOSReleaseVariables(
  cmExecutionStatus& status)
{
  auto& makefile = status.GetMakefile();
  const auto& sysroot = makefile.GetSafeDefinition("CMAKE_SYSROOT");

  std::map<std::string, std::string> data;
  // Based on
  // https://www.freedesktop.org/software/systemd/man/latest/os-release.html
  for (auto name : { "/etc/os-release"_s, "/usr/lib/os-release"_s }) {
    const auto& filename = cmStrCat(sysroot, name);
    if (cmSystemTools::FileExists(filename)) {
      cmsys::ifstream fin(filename.c_str());
      for (std::string line; !std::getline(fin, line).fail();) {
        auto kv = ParseOSReleaseLine(line);
        if (kv.has_value()) {
          data.emplace(kv.value());
        }
      }
      break;
    }
  }
  // Got smth?
  if (!data.empty()) {
    return data;
  }

  // Ugh, it could be some pre-os-release distro.
  // Lets try some fallback getters.
  // See also:
  //  - http://linuxmafia.com/faq/Admin/release-files.html

  // 1. CMake provided
  cmsys::Glob gl;
  std::vector<std::string> scripts;
  auto const findExpr = cmStrCat(cmSystemTools::GetCMakeRoot(),
                                 "/Modules/Internal/OSRelease/*.cmake");
  if (gl.FindFiles(findExpr)) {
    scripts = gl.GetFiles();
  }

  // 2. User provided (append to the CMake prvided)
  cmList::append(
    scripts, makefile.GetDefinition("CMAKE_GET_OS_RELEASE_FALLBACK_SCRIPTS"));

  // Filter out files that are not in format `NNN-name.cmake`
  auto checkName = [](std::string const& filepath) -> bool {
    auto const& filename = cmSystemTools::GetFilenameName(filepath);
    // NOTE Minimum filename length expected:
    //   NNN-<at-least-one-char-name>.cmake  --> 11
    return (filename.size() < 11) || !std::isdigit(filename[0]) ||
      !std::isdigit(filename[1]) || !std::isdigit(filename[2]) ||
      filename[3] != '-';
  };
  scripts.erase(std::remove_if(scripts.begin(), scripts.end(), checkName),
                scripts.end());

  // Make sure scripts are running in desired order
  std::sort(scripts.begin(), scripts.end(),
            [](std::string const& lhs, std::string const& rhs) -> bool {
              long lhs_order;
              cmStrToLong(cmSystemTools::GetFilenameName(lhs).substr(0u, 3u),
                          &lhs_order);
              long rhs_order;
              cmStrToLong(cmSystemTools::GetFilenameName(rhs).substr(0u, 3u),
                          &rhs_order);
              return lhs_order < rhs_order;
            });

  // Name of the variable to put the results
  std::string const result_variable{ "CMAKE_GET_OS_RELEASE_FALLBACK_RESULT" };

  for (auto const& script : scripts) {
    // Unset the result variable
    makefile.RemoveDefinition(result_variable);

    // include FATAL_ERROR and ERROR in the return status
    if (!makefile.ReadListFile(script) ||
        cmSystemTools::GetErrorOccurredFlag()) {
      // Ok, no worries... go try the next script.
      continue;
    }

    cmList variables{ makefile.GetDefinition(result_variable) };
    if (variables.empty()) {
      // Heh, this script didn't found anything... go try the next one.
      continue;
    }

    for (auto const& variable : variables) {
      auto value = makefile.GetSafeDefinition(variable);
      makefile.RemoveDefinition(variable);

      if (!cmHasPrefix(variable, cmStrCat(result_variable, '_'))) {
        // Ignore unknown variable set by the script
        continue;
      }

      auto key = variable.substr(result_variable.size() + 1,
                                 variable.size() - result_variable.size() - 1);
      data.emplace(std::move(key), std::move(value));
    }

    // Try 'till some script can get anything
    if (!data.empty()) {
      data.emplace("USED_FALLBACK_SCRIPT", script);
      break;
    }
  }

  makefile.RemoveDefinition(result_variable);

  return data;
}